

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O3

int serial_find_by_fd(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)bv + 0x10) <= *av) {
    uVar1 = (uint)(*(int *)((long)bv + 0x10) < *av);
  }
  return uVar1;
}

Assistant:

static int serial_find_by_fd(void *av, void *bv)
{
    int a = *(int *)av;
    Serial *b = (Serial *)bv;

    if (a < b->fd)
        return -1;
    else if (a > b->fd)
        return +1;
    return 0;
}